

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTestTest.cpp
# Opt level: O0

void __thiscall SuiteTestTest::SuiteTestTest(SuiteTestTest *this)

{
  shared_ptr<oout::EqualMatch> local_170;
  shared_ptr<oout::EqualMatch> local_160;
  shared_ptr<oout::EqualMatch> local_148;
  shared_ptr<oout::FunctionText> local_138;
  undefined1 local_128 [24];
  shared_ptr<oout::NamedTest> local_110;
  shared_ptr<oout::EqualTest> local_100;
  shared_ptr<oout::EqualTest> local_f0;
  shared_ptr<oout::EqualTest> local_e0;
  undefined1 local_d0 [24];
  shared_ptr<TestText> local_b8;
  shared_ptr<oout::NamedTest> local_a8;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_98;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_80;
  shared_ptr<TestText> local_68;
  shared_ptr<oout::NamedTest> local_58 [2];
  allocator<char> local_31;
  string local_30;
  SuiteTestTest *local_10;
  SuiteTestTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"SuiteTestTest",&local_31);
  local_98.
  super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_98.
  super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_98.
  super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            (&local_98);
  std::
  make_unique<oout::SuiteTest,std::__cxx11::list<std::shared_ptr<oout::Test_const>,std::allocator<std::shared_ptr<oout::Test_const>>>>
            (&local_80);
  std::make_shared<TestText,std::unique_ptr<oout::SuiteTest,std::default_delete<oout::SuiteTest>>>
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)
             &local_80.
              super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev);
  std::make_shared<oout::EqualTest,std::shared_ptr<TestText>,char_const(&)[8]>
            (&local_68,
             (char (*) [8])
             &local_80.
              super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev);
  std::make_shared<oout::NamedTest,char_const(&)[44],std::shared_ptr<oout::EqualTest>>
            ((char (*) [44])local_58,
             (shared_ptr<oout::EqualTest> *)"SuiteTest with empty list is always success");
  std::make_shared<oout::EqualTest,char_const(&)[2],char_const(&)[2]>
            ((char (*) [2])&local_e0,(char (*) [2])0x2c69c7);
  std::make_shared<oout::EqualTest,char_const(&)[2],char_const(&)[2]>
            ((char (*) [2])&local_f0,(char (*) [2])0x2c69cb);
  std::make_shared<oout::EqualTest,char_const(&)[2],char_const(&)[2]>
            ((char (*) [2])&local_100,(char (*) [2])0x2c69cf);
  std::
  make_unique<oout::SuiteTest,std::shared_ptr<oout::EqualTest>,std::shared_ptr<oout::EqualTest>,std::shared_ptr<oout::EqualTest>>
            ((shared_ptr<oout::EqualTest> *)local_d0,&local_e0,&local_f0);
  std::make_shared<TestText,std::unique_ptr<oout::SuiteTest,std::default_delete<oout::SuiteTest>>>
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)(local_d0 + 8));
  std::make_shared<oout::EqualTest,std::shared_ptr<TestText>,char_const(&)[8]>
            (&local_b8,(char (*) [8])(local_d0 + 8));
  std::make_shared<oout::NamedTest,char_const(&)[38],std::shared_ptr<oout::EqualTest>>
            ((char (*) [38])&local_a8,
             (shared_ptr<oout::EqualTest> *)"SuiteTest give tests as variadic args");
  std::make_shared<oout::FunctionText,SuiteTestTest::SuiteTestTest()::__0>
            ((anon_class_1_0_00000001 *)&local_148);
  std::make_shared<oout::EqualMatch,char_const(&)[5]>((char (*) [5])&local_160);
  std::
  make_shared<oout::MatchTest,std::shared_ptr<oout::FunctionText>,std::shared_ptr<oout::EqualMatch>>
            (&local_138,&local_148);
  std::make_unique<oout::SuiteTest,std::shared_ptr<oout::MatchTest>>
            ((shared_ptr<oout::MatchTest> *)local_128);
  std::make_shared<TestText,std::unique_ptr<oout::SuiteTest,std::default_delete<oout::SuiteTest>>>
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)(local_128 + 8));
  std::make_shared<oout::EqualMatch,char_const(&)[6]>((char (*) [6])&local_170);
  std::
  make_shared<oout::NamedTest,char_const(&)[46],std::shared_ptr<TestText>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [46])&local_110,
             (shared_ptr<TestText> *)"SuiteTest run each test in SafeTest decorator",
             (shared_ptr<oout::EqualMatch> *)(local_128 + 8));
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>,std::shared_ptr<oout::NamedTest>>
            (&this->super_Test,&local_30,local_58,&local_a8,&local_110);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(&local_110);
  std::shared_ptr<oout::EqualMatch>::~shared_ptr(&local_170);
  std::shared_ptr<TestText>::~shared_ptr((shared_ptr<TestText> *)(local_128 + 8));
  std::unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_>::~unique_ptr
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)local_128);
  std::shared_ptr<oout::MatchTest>::~shared_ptr((shared_ptr<oout::MatchTest> *)&local_138);
  std::shared_ptr<oout::EqualMatch>::~shared_ptr(&local_160);
  std::shared_ptr<oout::FunctionText>::~shared_ptr((shared_ptr<oout::FunctionText> *)&local_148);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(&local_a8);
  std::shared_ptr<oout::EqualTest>::~shared_ptr((shared_ptr<oout::EqualTest> *)&local_b8);
  std::shared_ptr<TestText>::~shared_ptr((shared_ptr<TestText> *)(local_d0 + 8));
  std::unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_>::~unique_ptr
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)local_d0);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_100);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_f0);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_e0);
  std::shared_ptr<oout::NamedTest>::~shared_ptr(local_58);
  std::shared_ptr<oout::EqualTest>::~shared_ptr((shared_ptr<oout::EqualTest> *)&local_68);
  std::shared_ptr<TestText>::~shared_ptr
            ((shared_ptr<TestText> *)
             &local_80.
              super__List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              ._M_impl._M_node.super__List_node_base._M_prev);
  std::unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_>::~unique_ptr
            ((unique_ptr<oout::SuiteTest,_std::default_delete<oout::SuiteTest>_> *)&local_80);
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::
  ~list(&local_98);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__SuiteTestTest_00324b20;
  return;
}

Assistant:

SuiteTestTest::SuiteTestTest()
: dirty::Test(
	"SuiteTestTest",
	make_shared<NamedTest>(
		"SuiteTest with empty list is always success",
		make_shared<EqualTest>(
			make_shared<TestText>(
				make_unique<SuiteTest>(
					list<shared_ptr<const oout::Test>>{}
				)
			),
			"success"
		)
	),
	make_shared<NamedTest>(
		"SuiteTest give tests as variadic args",
		make_shared<EqualTest>(
			make_shared<TestText>(
				make_unique<SuiteTest>(
					make_shared<EqualTest>("1", "1"),
					make_shared<EqualTest>("2", "2"),
					make_shared<EqualTest>("3", "3")
				)
			),
			"success"
		)
	),
	make_shared<NamedTest>(
		"SuiteTest run each test in SafeTest decorator",
		make_shared<TestText>(
			make_unique<SuiteTest>(
				make_shared<MatchTest>(
					make_shared<FunctionText>(
						[]() -> string {
							throw runtime_error("Shit");
						}
					),
					make_shared<EqualMatch>("Good")  // Not happen
				)
			)
		),
		make_shared<EqualMatch>("error")
	)
)
{
}